

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost_inc.h
# Opt level: O2

double BrotliPopulationCostCommand(HistogramCommand *histogram)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint32_t __brotli_swap_tmp;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined4 uVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_e8;
  double local_c8;
  uint32_t histo [4];
  size_t s [5];
  
  uVar15 = histogram->total_count_;
  local_e8 = 12.0;
  if (uVar15 == 0) {
    return 12.0;
  }
  iVar6 = 0;
  for (sVar10 = 0; iVar7 = iVar6, sVar10 != 0x2c0; sVar10 = sVar10 + 1) {
    if (histogram->data_[sVar10] != 0) {
      s[iVar6] = sVar10;
      iVar7 = iVar6 + 1;
      bVar3 = 3 < iVar6;
      iVar6 = iVar7;
      if (bVar3) break;
    }
  }
  uVar23 = (undefined4)(uVar15 >> 0x20);
  switch(iVar7) {
  case 1:
    break;
  case 2:
    auVar21._8_4_ = uVar23;
    auVar21._0_8_ = uVar15;
    auVar21._12_4_ = 0x45300000;
    local_e8 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0) + 20.0;
    break;
  case 3:
    uVar8 = histogram->data_[s[0]];
    uVar1 = histogram->data_[s[1]];
    uVar2 = histogram->data_[s[2]];
    uVar9 = uVar2;
    if (uVar2 < uVar1) {
      uVar9 = uVar1;
    }
    if (uVar9 < uVar8) {
      uVar9 = uVar8;
    }
    local_e8 = (double)((uVar1 + uVar8 + uVar2) * 2) + 28.0;
    goto LAB_00113f54;
  case 4:
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      histo[lVar12] = histogram->data_[s[lVar12]];
    }
    lVar12 = 0;
    while (lVar4 = lVar12, lVar4 != 4) {
      for (lVar11 = lVar4 + 1; lVar12 = lVar4 + 1, lVar11 != 4; lVar11 = lVar11 + 1) {
        uVar9 = histo[lVar11];
        if (histo[lVar4] < uVar9) {
          histo[lVar11] = histo[lVar4];
          histo[lVar4] = uVar9;
        }
      }
    }
    uVar8 = histo[3] + histo[2];
    uVar9 = histo[0];
    if (histo[0] < uVar8) {
      uVar9 = uVar8;
    }
    local_e8 = (double)((histo[0] + histo[1]) * 2) + (double)(uVar8 * 3) + 37.0;
LAB_00113f54:
    local_e8 = local_e8 - (double)uVar9;
    break;
  default:
    histo[0] = 0;
    histo[1] = 0;
    histo[2] = 0;
    histo[3] = 0;
    if (uVar15 < 0x100) {
      dVar20 = kLog2Table[uVar15];
    }
    else {
      auVar22._8_4_ = uVar23;
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = 0x45300000;
      dVar20 = log2((auVar22._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0));
    }
    uVar15 = 1;
    local_e8 = 0.0;
    uVar13 = 0;
    while (uVar13 < 0x2c0) {
      uVar9 = histogram->data_[uVar13];
      uVar16 = (ulong)uVar9;
      if (uVar16 == 0) {
        uVar9 = 0x2c0 - (int)uVar13;
        for (lVar12 = 0; 0x2bf - uVar13 != lVar12; lVar12 = lVar12 + 1) {
          if (histogram->data_[uVar13 + lVar12 + 1] != 0) {
            uVar9 = (int)lVar12 + 1;
            break;
          }
        }
        uVar13 = uVar13 + uVar9;
        if (uVar13 == 0x2c0) break;
        if (uVar9 < 3) {
          histo[0] = histo[0] + uVar9;
        }
        else {
          for (uVar9 = uVar9 - 2; uVar9 != 0; uVar9 = uVar9 >> 3) {
            local_e8 = local_e8 + 3.0;
          }
        }
      }
      else {
        if (uVar9 < 0x100) {
          dVar17 = kLog2Table[uVar16];
        }
        else {
          dVar17 = log2((double)uVar9);
          uVar16 = (ulong)histogram->data_[uVar13];
        }
        dVar18 = (dVar20 - dVar17) + 0.5;
        uVar5 = (ulong)dVar18;
        uVar5 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
        local_e8 = local_e8 + (double)uVar16 * (dVar20 - dVar17);
        if (0xe < uVar5) {
          uVar5 = 0xf;
        }
        if (uVar15 < uVar5) {
          uVar15 = uVar5;
        }
        histo[uVar5 & 0xffffffff] = histo[uVar5 & 0xffffffff] + 1;
        uVar13 = uVar13 + 1;
      }
    }
    dVar20 = 0.0;
    uVar13 = 0;
    for (uVar16 = 0; uVar16 < 0x48; uVar16 = uVar16 + 8) {
      uVar5 = (ulong)*(uint *)((long)histo + uVar16);
      if (uVar5 < 0x100) {
        dVar17 = kLog2Table[uVar5];
        local_c8 = (double)(int)*(uint *)((long)histo + uVar16);
      }
      else {
        local_c8 = (double)uVar5;
        dVar17 = log2(local_c8);
      }
      uVar14 = (ulong)*(uint *)((long)histo + uVar16 + 4);
      if (uVar14 < 0x100) {
        dVar18 = kLog2Table[uVar14];
      }
      else {
        dVar18 = log2((double)uVar14);
      }
      uVar13 = uVar13 + uVar5 + uVar14;
      dVar20 = (dVar20 - local_c8 * dVar17) - (double)uVar14 * dVar18;
    }
    auVar19._8_4_ = (int)(uVar13 >> 0x20);
    auVar19._0_8_ = uVar13;
    auVar19._12_4_ = 0x45300000;
    dVar17 = (auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
    if (uVar13 != 0) {
      if (uVar13 < 0x100) {
        dVar18 = kLog2Table[uVar13];
      }
      else {
        dVar18 = log2(dVar17);
      }
      dVar20 = dVar20 + dVar18 * dVar17;
    }
    if (dVar17 <= dVar20) {
      dVar17 = dVar20;
    }
    local_e8 = local_e8 + (double)(long)(uVar15 * 2 + 0x12) + dVar17;
  }
  return local_e8;
}

Assistant:

double FN(BrotliPopulationCost)(const HistogramType* histogram) {
  static const double kOneSymbolHistogramCost = 12;
  static const double kTwoSymbolHistogramCost = 20;
  static const double kThreeSymbolHistogramCost = 28;
  static const double kFourSymbolHistogramCost = 37;
  const size_t data_size = FN(HistogramDataSize)();
  int count = 0;
  size_t s[5];
  double bits = 0.0;
  size_t i;
  if (histogram->total_count_ == 0) {
    return kOneSymbolHistogramCost;
  }
  for (i = 0; i < data_size; ++i) {
    if (histogram->data_[i] > 0) {
      s[count] = i;
      ++count;
      if (count > 4) break;
    }
  }
  if (count == 1) {
    return kOneSymbolHistogramCost;
  }
  if (count == 2) {
    return (kTwoSymbolHistogramCost + (double)histogram->total_count_);
  }
  if (count == 3) {
    const uint32_t histo0 = histogram->data_[s[0]];
    const uint32_t histo1 = histogram->data_[s[1]];
    const uint32_t histo2 = histogram->data_[s[2]];
    const uint32_t histomax =
        BROTLI_MAX(uint32_t, histo0, BROTLI_MAX(uint32_t, histo1, histo2));
    return (kThreeSymbolHistogramCost +
            2 * (histo0 + histo1 + histo2) - histomax);
  }
  if (count == 4) {
    uint32_t histo[4];
    uint32_t h23;
    uint32_t histomax;
    for (i = 0; i < 4; ++i) {
      histo[i] = histogram->data_[s[i]];
    }
    /* Sort */
    for (i = 0; i < 4; ++i) {
      size_t j;
      for (j = i + 1; j < 4; ++j) {
        if (histo[j] > histo[i]) {
          BROTLI_SWAP(uint32_t, histo, j, i);
        }
      }
    }
    h23 = histo[2] + histo[3];
    histomax = BROTLI_MAX(uint32_t, h23, histo[0]);
    return (kFourSymbolHistogramCost +
            3 * h23 + 2 * (histo[0] + histo[1]) - histomax);
  }

  {
    /* In this loop we compute the entropy of the histogram and simultaneously
       build a simplified histogram of the code length codes where we use the
       zero repeat code 17, but we don't use the non-zero repeat code 16. */
    size_t max_depth = 1;
    uint32_t depth_histo[BROTLI_CODE_LENGTH_CODES] = { 0 };
    const double log2total = FastLog2(histogram->total_count_);
    for (i = 0; i < data_size;) {
      if (histogram->data_[i] > 0) {
        /* Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
                                    = log2(total_count) - log2(count(symbol)) */
        double log2p = log2total - FastLog2(histogram->data_[i]);
        /* Approximate the bit depth by round(-log2(P(symbol))) */
        size_t depth = (size_t)(log2p + 0.5);
        bits += histogram->data_[i] * log2p;
        if (depth > 15) {
          depth = 15;
        }
        if (depth > max_depth) {
          max_depth = depth;
        }
        ++depth_histo[depth];
        ++i;
      } else {
        /* Compute the run length of zeros and add the appropriate number of 0
           and 17 code length codes to the code length code histogram. */
        uint32_t reps = 1;
        size_t k;
        for (k = i + 1; k < data_size && histogram->data_[k] == 0; ++k) {
          ++reps;
        }
        i += reps;
        if (i == data_size) {
          /* Don't add any cost for the last zero run, since these are encoded
             only implicitly. */
          break;
        }
        if (reps < 3) {
          depth_histo[0] += reps;
        } else {
          reps -= 2;
          while (reps > 0) {
            ++depth_histo[BROTLI_REPEAT_ZERO_CODE_LENGTH];
            /* Add the 3 extra bits for the 17 code length code. */
            bits += 3;
            reps >>= 3;
          }
        }
      }
    }
    /* Add the estimated encoding cost of the code length code histogram. */
    bits += (double)(18 + 2 * max_depth);
    /* Add the entropy of the code length code histogram. */
    bits += BitsEntropy(depth_histo, BROTLI_CODE_LENGTH_CODES);
  }
  return bits;
}